

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void GetReplace(bitset<32UL> flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  reference local_60 [2];
  reference local_40;
  reference local_30;
  reference local_20;
  _Base_bitset<1UL> local_10;
  bitset<32UL> flags_local;
  
  local_10 = flags.super__Base_bitset<1UL>._M_w;
  if (t_assoc != direct_mapped) {
    if (t_assoc == full_associative) {
      if (t_replace == Random) {
        iVar4 = rand();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = i_num_line;
        current_line = (ulong)(long)iVar4 /
                       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0) + 1U);
      }
      else if (t_replace == LRU) {
        LruUnhitUnspace();
      }
    }
    else if (t_assoc == set_associative) {
      if (t_replace == Random) {
        iVar4 = rand();
        auVar2._8_8_ = 0;
        auVar2._0_8_ = i_cache_set;
        temp = (ulong)(long)iVar4 /
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar2,0) + 1U);
        current_line = current_set * i_cache_set + temp;
      }
      else if (t_replace == LRU) {
        LruUnhitUnspace();
      }
    }
  }
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_20,(size_t)(cache_item + current_line));
  bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)&local_20);
  std::bitset<32UL>::reference::~reference(&local_20);
  if (bVar3) {
    GetWrite();
  }
  j = 0x1c;
  for (i = 0x1f; 0x1f - (ulong)bit_tag < i; i = i - 1) {
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_30,(size_t)&local_10);
    std::bitset<32UL>::operator[]((bitset<32UL> *)&local_40,(size_t)(cache_item + current_line));
    std::bitset<32UL>::reference::operator=(&local_40,&local_30);
    std::bitset<32UL>::reference::~reference(&local_40);
    std::bitset<32UL>::reference::~reference(&local_30);
    j = j - 1;
  }
  std::bitset<32UL>::operator[]((bitset<32UL> *)local_60,(size_t)(cache_item + current_line));
  std::bitset<32UL>::reference::operator=(local_60,true);
  std::bitset<32UL>::reference::~reference(local_60);
  return;
}

Assistant:

void GetReplace(bitset<32> flags)
{
    if(t_assoc == direct_mapped)
    {
    }
    else if(t_assoc == full_associative)
    {
        if(t_replace == Random)
        {
            current_line = rand()/(RAND_MAX/i_num_line+1); // a random line in(0,i_num_line-1)
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }
    else if(t_assoc == set_associative) // 从本组中任选一行，进行替换
    {
        if(t_replace == Random)
        {
            temp = rand()/(RAND_MAX/i_cache_set+1); // a random line in(0,i_cache_set-1)
            current_line = current_set*i_cache_set+temp; // a random line in current_set
        }
        else if(t_replace == LRU)
        {
            LruUnhitUnspace();
        }
    }

    if(cache_item[current_line][29]) //dirty位必须为1才写入
    {
        GetWrite(); //写入内存
    }

#ifndef NDEBUG
    cout << "Read from Main Memory to Cache: " << endl;
#endif // NDEBUG

    for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //设置标记
    {
        cache_item[current_line][j] = flags[i];
        assert(j>0);
    }

    cache_item[current_line][30] = true; //设置hit位为true
}